

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_publisher_link.cpp
# Opt level: O3

void __thiscall miniros::TransportPublisherLink::drop(TransportPublisherLink *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Subscription *this_01;
  _Atomic_word _Var2;
  bool bVar3;
  PublisherLinkPtr PStack_28;
  
  this->dropping_ = true;
  Connection::drop((this->connection_).
                   super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   Destructing);
  this_00 = (this->super_PublisherLink).parent_.
            super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var2 = this_00->_M_use_count;
    do {
      if (_Var2 == 0) {
        return;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar3 = _Var2 == iVar1;
      if (bVar3) {
        this_00->_M_use_count = _Var2 + 1;
        iVar1 = _Var2;
      }
      _Var2 = iVar1;
      UNLOCK();
    } while (!bVar3);
    this_01 = (this->super_PublisherLink).parent_.
              super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_01 != (Subscription *)0x0 && this_00->_M_use_count != 0) {
      std::__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<miniros::PublisherLink,void>
                ((__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2> *)&PStack_28,
                 (__weak_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this->super_PublisherLink).super_enable_shared_from_this<miniros::PublisherLink>)
      ;
      Subscription::removePublisherLink(this_01,&PStack_28);
      if (PStack_28.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (PStack_28.super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void TransportPublisherLink::drop()
{
  dropping_ = true;
  connection_->drop(Connection::Destructing);

  if (SubscriptionPtr parent = parent_.lock())
  {
    parent->removePublisherLink(shared_from_this());
  }
}